

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O1

void telnet_receive(Plug *plug,int urgent,char *data,size_t len)

{
  byte bVar1;
  _func_void_Plug_ptr_int_char_ptr_size_t *p_Var2;
  _func_void_Plug_ptr_PlugCloseType_char_ptr *p_Var3;
  Plug *pPVar4;
  _Bool _Var5;
  undefined4 uVar6;
  uint uVar7;
  strbuf *buf;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  long lVar11;
  PlugVtable *pPVar12;
  size_t sVar13;
  undefined2 *ptr;
  ulong uVar14;
  char cVar15;
  int iVar16;
  int iVar17;
  Telnet *telnet;
  long lVar18;
  uint option;
  _func_void_Plug_ptr_int_char_ptr_size_t *p_Var19;
  char cVar20;
  int iVar21;
  LogContext *pLVar22;
  char *local_68;
  Plug *local_60;
  uint local_54;
  char *local_50;
  strbuf *local_48;
  BinarySink *local_40;
  Telnet *local_38;
  
  if (urgent != 0) {
    *(undefined1 *)&plug[-5].vt = 1;
  }
  buf = strbuf_new_nm();
  if (len != 0) {
    telnet = (Telnet *)(plug + -0x13);
    local_40 = buf->binarysink_;
    local_38 = telnet;
    do {
      uVar7 = *(uint *)&plug[-3].vt;
      if (9 < uVar7) goto LAB_0013bbe2;
      bVar1 = *data;
      option = (uint)bVar1;
      switch(uVar7) {
      default:
        uVar6 = 1;
        if ((bVar1 != 0xff) &&
           ((bVar1 != 0 || ((uVar6 = 0, uVar7 != 9 && (uVar6 = 1, option != 0xff)))))) {
          if (*(char *)&plug[-5].vt == '\0') {
            BinarySink_put_byte(local_40,bVar1);
LAB_0013bc44:
            if (bVar1 != 0xd) goto switchD_0013bb7d_caseD_f3;
          }
          else if (option != 0xd) {
            if (bVar1 != 0xf2) goto switchD_0013bb7d_caseD_f3;
            *(undefined1 *)&plug[-5].vt = 0;
            goto LAB_0013bc44;
          }
          uVar6 = 9;
          if (*(int *)((long)&plug[-8].vt + 4) == 1) goto switchD_0013bb7d_caseD_f3;
        }
        break;
      case 1:
        switch(bVar1) {
        case 0xf2:
          *(undefined1 *)&plug[-5].vt = 0;
        default:
          goto switchD_0013bb7d_caseD_f3;
        case 0xfa:
          uVar6 = 6;
          break;
        case 0xfb:
          uVar6 = 2;
          break;
        case 0xfc:
          uVar6 = 3;
          break;
        case 0xfd:
          uVar6 = 4;
          break;
        case 0xfe:
          uVar6 = 5;
          break;
        case 0xff:
          BinarySink_put_byte(local_40,bVar1);
          goto switchD_0013bb7d_caseD_f3;
        }
        break;
      case 2:
        iVar16 = 0xfb;
        goto LAB_0013bbb3;
      case 3:
        iVar16 = 0xfc;
        goto LAB_0013bbb3;
      case 4:
        iVar16 = 0xfd;
        goto LAB_0013bbb3;
      case 5:
        iVar16 = 0xfe;
LAB_0013bbb3:
        proc_rec_opt(telnet,iVar16,option);
switchD_0013bb7d_caseD_f3:
        uVar6 = 0;
        break;
      case 6:
        *(uint *)((long)&plug[-5].vt + 4) = option;
        strbuf_shrink_to((strbuf *)plug[-4].vt,0);
LAB_0013bbd9:
        uVar6 = 7;
        break;
      case 7:
        if (option != 0xff) {
LAB_0013bbca:
          BinarySink_put_byte((BinarySink *)&(plug[-4].vt)->sent,bVar1);
          goto LAB_0013bbd9;
        }
        uVar6 = 8;
        break;
      case 8:
        if (option != 0xf0) goto LAB_0013bbca;
        iVar16 = *(int *)((long)&plug[-5].vt + 4);
        if (iVar16 < 0x24) {
          if (iVar16 == 0x18) {
            if (((plug[-4].vt)->receive == (_func_void_Plug_ptr_int_char_ptr_size_t *)0x1) &&
               (*(plug[-4].vt)->closing == (_func_void_Plug_ptr_PlugCloseType_char_ptr)0x1)) {
              local_60 = plug;
              pcVar8 = conf_get_str((Conf *)plug[-2].vt,0x35);
              sVar9 = strlen(pcVar8);
              pcVar10 = (char *)safemalloc(sVar9 + 0x14,1,0);
              plug = local_60;
              pcVar10[0] = -1;
              pcVar10[1] = -6;
              pcVar10[2] = '\x18';
              pcVar10[3] = '\0';
              cVar20 = *pcVar8;
              if (cVar20 == '\0') {
                iVar16 = 6;
                lVar11 = 0;
              }
              else {
                lVar11 = 0;
                do {
                  lVar18 = lVar11;
                  cVar15 = cVar20 + -0x20;
                  if (0x19 < (byte)(cVar20 + 0x9fU)) {
                    cVar15 = cVar20;
                  }
                  (pcVar10 + 4)[lVar18] = cVar15;
                  cVar20 = pcVar8[lVar18 + 1];
                  lVar11 = lVar18 + 1;
                } while (cVar20 != '\0');
                iVar16 = (int)lVar18 + 7;
              }
              (pcVar10 + lVar11 + 4)[0] = -1;
              (pcVar10 + lVar11 + 4)[1] = -0x10;
              pPVar12 = (PlugVtable *)
                        (**(code **)((local_60[-0x13].vt)->log + 0x10))
                                  (local_60[-0x13].vt,pcVar10,iVar16);
              plug[-6].vt = pPVar12;
              pcVar10[lVar11 + 4] = '\0';
              logevent((LogContext *)plug[-0x10].vt,"server subnegotiation: SB TTYPE SEND");
              logeventf((LogContext *)plug[-0x10].vt,"client subnegotiation: SB TTYPE IS %s",
                        pcVar10 + 4);
              goto LAB_0013c13e;
            }
            pLVar22 = (LogContext *)plug[-0x10].vt;
            pcVar8 = "server subnegotiation: SB TTYPE <something weird>\r\n";
LAB_0013bdef:
            logevent(pLVar22,pcVar8);
          }
          else if (iVar16 == 0x20) {
            if (((plug[-4].vt)->receive != (_func_void_Plug_ptr_int_char_ptr_size_t *)0x1) ||
               (*(plug[-4].vt)->closing != (_func_void_Plug_ptr_PlugCloseType_char_ptr)0x1)) {
              pLVar22 = (LogContext *)plug[-0x10].vt;
              pcVar8 = "server subnegotiation: SB TSPEED <something weird>";
              goto LAB_0013bdef;
            }
            pcVar8 = conf_get_str((Conf *)plug[-2].vt,0x36);
            sVar9 = strlen(pcVar8);
            pcVar10 = (char *)safemalloc(sVar9 + 0x14,1,0);
            pcVar10[0] = -1;
            pcVar10[1] = -6;
            pcVar10[2] = ' ';
            pcVar10[3] = '\0';
            strcpy(pcVar10 + 4,pcVar8);
            sVar9 = strlen(pcVar8);
            lVar11 = sVar9 << 0x20;
            pcVar10[lVar11 + 0x400000000 >> 0x20] = -1;
            pcVar10[lVar11 + 0x500000000 >> 0x20] = -0x10;
            pPVar12 = (PlugVtable *)
                      (**(code **)((plug[-0x13].vt)->log + 0x10))
                                (plug[-0x13].vt,pcVar10,lVar11 + 0x600000000 >> 0x20);
            plug[-6].vt = pPVar12;
            logevent((LogContext *)plug[-0x10].vt,"server subnegotiation: SB TSPEED SEND");
            logeventf((LogContext *)plug[-0x10].vt,"client subnegotiation: SB TSPEED IS %s",pcVar8);
LAB_0013c13e:
            safefree(pcVar10);
          }
        }
        else if ((iVar16 == 0x24) || (iVar16 == 0x27)) {
          p_Var2 = (plug[-4].vt)->receive;
          if ((0 < (long)p_Var2) &&
             (p_Var3 = (plug[-4].vt)->closing,
             *p_Var3 == (_func_void_Plug_ptr_PlugCloseType_char_ptr)0x1)) {
            pLVar22 = (LogContext *)plug[-0x10].vt;
            local_60 = plug;
            pcVar8 = telopt(iVar16);
            pPVar4 = local_60;
            logeventf(pLVar22,"server subnegotiation: SB %s SEND",pcVar8);
            uVar7 = 0;
            _Var5 = true;
            if (*(int *)((long)&pPVar4[-5].vt + 4) == 0x24) {
              _Var5 = conf_get_bool((Conf *)pPVar4[-2].vt,0x3c);
              uVar7 = (uint)!_Var5;
              if (p_Var2 == (_func_void_Plug_ptr_int_char_ptr_size_t *)0x1) {
                uVar7 = (uint)!_Var5;
              }
              else {
                p_Var19 = (_func_void_Plug_ptr_int_char_ptr_size_t *)(p_Var3 + 1);
                do {
                  bVar1 = (byte)*p_Var19;
                  if (bVar1 == 0) {
                    _Var5 = true;
                    uVar7 = (uint)bVar1;
                  }
                  else if (bVar1 == 1) {
                    _Var5 = false;
                    uVar7 = 1;
                  }
                  p_Var19 = p_Var19 + 1;
                } while (p_Var19 < p_Var2 + (long)p_Var3);
              }
            }
            local_54 = uVar7;
            local_48 = buf;
            pcVar8 = conf_get_str_strs((Conf *)pPVar4[-2].vt,0x38,(char *)0x0,&local_68);
            if (pcVar8 == (char *)0x0) {
              iVar16 = 0x14;
            }
            else {
              iVar16 = 0x14;
              do {
                pcVar10 = local_68;
                sVar9 = strlen(local_68);
                sVar13 = strlen(pcVar8);
                iVar16 = iVar16 + (int)sVar13 + (int)sVar9 + 2;
                pcVar8 = conf_get_str_strs((Conf *)local_60[-2].vt,0x38,pcVar10,&local_68);
              } while (pcVar8 != (char *)0x0);
            }
            plug = local_60;
            local_50 = get_remote_username((Conf *)local_60[-2].vt);
            if (local_50 != (char *)0x0) {
              sVar9 = strlen(local_50);
              iVar16 = iVar16 + (int)sVar9 + 6;
            }
            ptr = (undefined2 *)safemalloc((long)iVar16,1,0);
            *ptr = 0xfaff;
            *(undefined1 *)(ptr + 1) = *(undefined1 *)((long)&plug[-5].vt + 4);
            *(undefined1 *)((long)ptr + 3) = 0;
            pcVar8 = conf_get_str_strs((Conf *)plug[-2].vt,0x38,(char *)0x0,&local_68);
            buf = local_48;
            iVar16 = 4;
            while (pcVar8 != (char *)0x0) {
              *(char *)((long)ptr + (long)iVar16) = (char)local_54;
              iVar21 = iVar16 + 1;
              cVar20 = *local_68;
              if (cVar20 != '\0') {
                lVar11 = 0;
                do {
                  iVar17 = iVar16;
                  *(char *)((long)ptr + lVar11 + iVar21) = cVar20;
                  cVar20 = local_68[lVar11 + 1];
                  iVar16 = iVar17 + 1;
                  lVar11 = lVar11 + 1;
                } while (cVar20 != '\0');
                iVar21 = iVar17 + 2;
              }
              iVar16 = iVar16 + 2;
              *(_Bool *)((long)ptr + (long)iVar21) = _Var5;
              cVar20 = *pcVar8;
              if (cVar20 != '\0') {
                lVar11 = 0;
                do {
                  *(char *)((long)ptr + lVar11 + iVar16) = cVar20;
                  cVar20 = pcVar8[lVar11 + 1];
                  lVar11 = lVar11 + 1;
                } while (cVar20 != '\0');
                iVar16 = iVar16 + (int)lVar11;
              }
              pcVar8 = conf_get_str_strs((Conf *)plug[-2].vt,0x38,local_68,&local_68);
            }
            if (local_50 != (char *)0x0) {
              lVar11 = (long)iVar16;
              *(char *)((long)ptr + lVar11) = (char)local_54;
              *(undefined4 *)((long)ptr + lVar11 + 1) = 0x52455355;
              iVar16 = iVar16 + 6;
              *(_Bool *)((long)ptr + lVar11 + 5) = _Var5;
              cVar20 = *local_50;
              if (cVar20 != '\0') {
                lVar11 = 0;
                do {
                  *(char *)((long)ptr + lVar11 + iVar16) = cVar20;
                  cVar20 = local_50[lVar11 + 1];
                  lVar11 = lVar11 + 1;
                } while (cVar20 != '\0');
                iVar16 = iVar16 + (int)lVar11;
              }
            }
            *(undefined2 *)((long)ptr + (long)iVar16) = 0xf0ff;
            pPVar12 = (PlugVtable *)
                      (**(code **)((plug[-0x13].vt)->log + 0x10))
                                (plug[-0x13].vt,ptr,(long)(iVar16 + 2));
            plug[-6].vt = pPVar12;
            pLVar22 = (LogContext *)plug[-0x10].vt;
            pcVar8 = telopt(*(int *)((long)&plug[-5].vt + 4));
            if (iVar16 + 2 == 6) {
              logeventf(pLVar22,"client subnegotiation: SB %s IS <nothing>",pcVar8);
              pcVar10 = local_50;
            }
            else {
              logeventf(pLVar22,"client subnegotiation: SB %s IS:",pcVar8);
              pcVar8 = conf_get_str_strs((Conf *)plug[-2].vt,0x38,(char *)0x0,&local_68);
              pcVar10 = local_50;
              while (local_50 = pcVar10, pcVar8 != (char *)0x0) {
                logeventf((LogContext *)plug[-0x10].vt,"    %s=%s",local_68,pcVar8);
                pcVar8 = conf_get_str_strs((Conf *)plug[-2].vt,0x38,local_68,&local_68);
                pcVar10 = local_50;
              }
              if (pcVar10 != (char *)0x0) {
                logeventf((LogContext *)plug[-0x10].vt,"    USER=%s",pcVar10);
              }
            }
            safefree(ptr);
            goto LAB_0013c13e;
          }
        }
        uVar6 = 0;
        telnet = local_38;
      }
      *(undefined4 *)&plug[-3].vt = uVar6;
LAB_0013bbe2:
      if (0xfff < buf->len) {
        (**(code **)(plug[-0x11].vt)->log)(plug[-0x11].vt,0,buf->u);
        (**(code **)((plug[-0x13].vt)->log + 0x28))();
        strbuf_shrink_to(buf,0);
      }
      len = len - 1;
      data = (char *)((byte *)data + 1);
    } while (len != 0);
  }
  if (buf->len != 0) {
    uVar14 = (**(code **)(plug[-0x11].vt)->log)(plug[-0x11].vt,0,buf->u);
    (**(code **)((plug[-0x13].vt)->log + 0x28))(plug[-0x13].vt,0x1000 < uVar14);
  }
  strbuf_free(buf);
  return;
}

Assistant:

static void telnet_receive(
    Plug *plug, int urgent, const char *data, size_t len)
{
    Telnet *telnet = container_of(plug, Telnet, plug);
    if (urgent)
        telnet->in_synch = true;
    do_telnet_read(telnet, data, len);
}